

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

int uECC_verify(uint8_t *public_key,uint8_t *hash,uint8_t *signature)

{
  uECC_word_t *puVar1;
  uint64_t *native;
  uECC_word_t *dest;
  uECC_word_t *puVar2;
  cmpresult_t cVar3;
  bitcount_t bVar4;
  int iVar5;
  uint uVar6;
  uECC_word_t result;
  uECC_word_t uVar7;
  ulong uVar8;
  swordcount_t i;
  uint uVar9;
  uECC_word_t *in_RCX;
  wordcount_t max_words;
  uECC_word_t *puVar11;
  uECC_word_t local_218;
  uECC_word_t tz [4];
  EccPoint sum;
  EccPoint public;
  uECC_word_t z [4];
  uECC_word_t tx [4];
  uECC_word_t ty [4];
  uECC_word_t ry [4];
  uECC_word_t u1 [4];
  uECC_word_t u2 [4];
  uECC_word_t r [4];
  uECC_word_t s [4];
  uECC_word_t rx [4];
  EccPoint *points [4];
  uECC_word_t *puVar10;
  
  r[2] = 0;
  s[2] = 0;
  vli_bytesToNative(sum.y + 3,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  vli_bytesToNative(u2 + 3,signature);
  vli_bytesToNative(r + 3,signature + 0x20);
  uVar7 = vli_isZero(u2 + 3);
  uVar6 = 0;
  if (uVar7 == 0) {
    uVar7 = vli_isZero(r + 3);
    if (uVar7 == 0) {
      cVar3 = vli_cmp(curve_n,u2 + 3);
      if (cVar3 == 1) {
        cVar3 = vli_cmp(curve_n,r + 3);
        uVar6 = 0;
        if (cVar3 == 1) {
          puVar1 = public.y + 3;
          vli_modInv(puVar1,r + 3,curve_n);
          native = ry + 3;
          u1[2] = 0;
          vli_bytesToNative(native,hash);
          vli_modMult_n(native,native,puVar1);
          vli_modMult_n(u1 + 3,u2 + 3,puVar1);
          puVar2 = tz + 3;
          vli_set(puVar2,sum.y + 3);
          vli_set(sum.x + 3,public.x + 3);
          puVar10 = z + 3;
          vli_set(puVar10,curve_G.x);
          vli_set(tx + 3,curve_G.y);
          vli_modSub(puVar1,puVar2,puVar10,in_RCX);
          puVar11 = sum.x + 3;
          XYcZ_add(puVar10,tx + 3,puVar2,puVar11);
          vli_modInv(puVar1,puVar1,curve_p);
          apply_z(puVar2,puVar11,puVar1);
          rx[3] = 0;
          max_words = (wordcount_t)puVar11;
          bVar4 = vli_numBits(ry + 3,max_words);
          iVar5 = vli_numBits(u1 + 3,max_words);
          if (iVar5 < bVar4) {
            iVar5 = bVar4;
          }
          uVar6 = iVar5 - 1;
          puVar2 = *(uECC_word_t **)
                    ((long)rx +
                    (ulong)((uint)((u1[(long)((int)uVar6 >> 6) + 3] >> ((ulong)uVar6 & 0x3f) & 1) !=
                                  0) * 0x10 +
                           (uint)((ry[(long)((int)uVar6 >> 6) + 3] >> ((ulong)uVar6 & 0x3f) & 1) !=
                                 0) * 8) + 0x18);
          vli_set(s + 3,puVar2);
          vli_set(ty + 3,puVar2 + 4);
          vli_clear(puVar1);
          public.y[3] = 1;
          uVar6 = iVar5 - 2;
          while( true ) {
            if ((int)uVar6 < 0) break;
            EccPoint_double_jacobian(s + 3,ty + 3,puVar1);
            uVar9 = (uint)((u1[(ulong)(uVar6 >> 6) + 3] >> ((ulong)uVar6 & 0x3f) & 1) != 0) * 0x10;
            puVar10 = (uECC_word_t *)(ulong)uVar9;
            puVar2 = *(uECC_word_t **)
                      ((long)rx +
                      (ulong)(uVar9 + (uint)((ry[(ulong)(uVar6 >> 6) + 3] >> ((ulong)uVar6 & 0x3f) &
                                             1) != 0) * 8) + 0x18);
            if (puVar2 != (uECC_word_t *)0x0) {
              puVar11 = z + 3;
              vli_set(puVar11,puVar2);
              dest = tx + 3;
              vli_set(dest,puVar2 + 4);
              apply_z(puVar11,dest,puVar1);
              vli_modSub(&local_218,s + 3,puVar11,puVar10);
              XYcZ_add(puVar11,dest,s + 3,ty + 3);
              vli_modMult_fast(puVar1,puVar1,&local_218);
            }
            uVar6 = uVar6 - 1;
          }
          puVar1 = public.y + 3;
          vli_modInv(puVar1,puVar1,curve_p);
          apply_z(s + 3,ty + 3,puVar1);
          cVar3 = vli_cmp(curve_n,s + 3);
          if (cVar3 != 1) {
            vli_sub(s + 3,s + 3,curve_n);
          }
          uVar8 = 0;
          for (uVar6 = 3; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
            uVar8 = uVar8 | u2[(ulong)uVar6 + 3] ^ s[(ulong)uVar6 + 3];
          }
          uVar6 = (uint)(uVar8 == 0);
        }
      }
    }
  }
  return uVar6;
}

Assistant:

int uECC_verify(const uint8_t public_key[uECC_BYTES*2],
                const uint8_t hash[uECC_BYTES],
                const uint8_t signature[uECC_BYTES*2]) {
    uECC_word_t u1[uECC_N_WORDS], u2[uECC_N_WORDS];
    uECC_word_t z[uECC_N_WORDS];
    EccPoint public, sum;
    uECC_word_t rx[uECC_WORDS];
    uECC_word_t ry[uECC_WORDS];
    uECC_word_t tx[uECC_WORDS];
    uECC_word_t ty[uECC_WORDS];
    uECC_word_t tz[uECC_WORDS];
    const EccPoint *points[4];
    const EccPoint *point;
    bitcount_t numBits;
    bitcount_t i;
    uECC_word_t r[uECC_N_WORDS], s[uECC_N_WORDS];
    r[uECC_N_WORDS - 1] = 0;
    s[uECC_N_WORDS - 1] = 0;

    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);
    vli_bytesToNative(r, signature);
    vli_bytesToNative(s, signature + uECC_BYTES);

    if (vli_isZero(r) || vli_isZero(s)) { /* r, s must not be 0. */
        return 0;
    }

#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, r) != 1 || vli_cmp(curve_n, s) != 1) { /* r, s must be < n. */
        return 0;
    }
#endif

    /* Calculate u1 and u2. */
    vli_modInv_n(z, s, curve_n); /* Z = s^-1 */
    u1[uECC_N_WORDS - 1] = 0;
    vli_bytesToNative(u1, hash);
    vli_modMult_n(u1, u1, z); /* u1 = e/s */
    vli_modMult_n(u2, r, z); /* u2 = r/s */

    /* Calculate sum = G + Q. */
    vli_set(sum.x, public.x);
    vli_set(sum.y, public.y);
    vli_set(tx, curve_G.x);
    vli_set(ty, curve_G.y);
    vli_modSub_fast(z, sum.x, tx); /* Z = x2 - x1 */
    XYcZ_add(tx, ty, sum.x, sum.y);
    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(sum.x, sum.y, z);

    /* Use Shamir's trick to calculate u1*G + u2*Q */
    points[0] = 0;
    points[1] = &curve_G;
    points[2] = &public;
    points[3] = &sum;
    numBits = smax(vli_numBits(u1, uECC_N_WORDS), vli_numBits(u2, uECC_N_WORDS));

    point = points[(!!vli_testBit(u1, numBits - 1)) | ((!!vli_testBit(u2, numBits - 1)) << 1)];
    vli_set(rx, point->x);
    vli_set(ry, point->y);
    vli_clear(z);
    z[0] = 1;

    for (i = numBits - 2; i >= 0; --i) {
        uECC_word_t index;
        EccPoint_double_jacobian(rx, ry, z);

        index = (!!vli_testBit(u1, i)) | ((!!vli_testBit(u2, i)) << 1);
        point = points[index];
        if (point) {
            vli_set(tx, point->x);
            vli_set(ty, point->y);
            apply_z(tx, ty, z);
            vli_modSub_fast(tz, rx, tx); /* Z = x2 - x1 */
            XYcZ_add(tx, ty, rx, ry);
            vli_modMult_fast(z, z, tz);
        }
    }

    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(rx, ry, z);

    /* v = x1 (mod n) */
#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, rx) != 1) {
        vli_sub(rx, rx, curve_n);
    }
#endif

    /* Accept only if v == r. */
    return vli_equal(rx, r);
}